

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

bool __thiscall FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator *this,CheckResult *item)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  DWORD DVar4;
  line_t_conflict *plVar5;
  bool bVar6;
  uint local_40;
  int nextflags;
  bool onlast;
  line_t_conflict *line;
  CheckResult *item_local;
  FMultiBlockLinesIterator *this_local;
  
  plVar5 = FBlockLinesIterator::Next(&this->blockIterator);
  if (plVar5 == (line_t_conflict *)0x0) {
    sVar1 = this->index;
    uVar3 = FPortalGroupArray::Size(this->checklist);
    bVar6 = (int)sVar1 + 1U < uVar3;
    if (bVar6) {
      DVar4 = FPortalGroupArray::operator[](this->checklist,(int)this->index + 1);
      local_40 = DVar4 & 0xc000;
    }
    else {
      local_40 = 0;
    }
    if ((this->portalflags == 0x20) && (local_40 != 0x8000)) {
      bVar2 = GoUp(this,(this->offset).X,(this->offset).Y);
      if (bVar2) {
        bVar6 = Next(this,item);
        return bVar6;
      }
    }
    else if ((this->portalflags == 0x40) &&
            ((local_40 != 0x4000 && (bVar2 = GoDown(this,(this->offset).X,(this->offset).Y), bVar2))
            )) {
      bVar6 = Next(this,item);
      return bVar6;
    }
    if (bVar6) {
      this->index = this->index + 1;
      DVar4 = FPortalGroupArray::operator[](this->checklist,(int)this->index);
      startIteratorForGroup(this,DVar4 & 0xffff3fff);
      if (local_40 == 0x4000) {
        this->portalflags = 0x40;
      }
      else if (local_40 == 0x8000) {
        this->portalflags = 0x20;
      }
      else {
        this->portalflags = 0;
      }
      this_local._7_1_ = Next(this,item);
    }
    else {
      this->cursector = this->startsector;
      bVar6 = GoUp(this,(this->checkpoint).X,(this->checkpoint).Y);
      if ((bVar6) || (bVar6 = GoDown(this,(this->checkpoint).X,(this->checkpoint).Y), bVar6)) {
        this_local._7_1_ = Next(this,item);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    item->line = (line_t *)plVar5;
    (item->Position).X = (this->offset).X;
    (item->Position).Y = (this->offset).Y;
    item->portalflags = (int)this->portalflags;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator::CheckResult *item)
{
	line_t *line = blockIterator.Next();
	if (line != NULL)
	{
		item->line = line;
		item->Position.X = offset.X;
		item->Position.Y = offset.Y;
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (portalflags == FFCF_NOFLOOR && nextflags != FPortalGroupArray::UPPER)
	{
		// if this is the last upper portal in the list, check if we need to go further up to find the real ceiling.
		if (GoUp(offset.X, offset.Y)) return Next(item);
	}
	else if (portalflags == FFCF_NOCEILING && nextflags != FPortalGroupArray::LOWER)
	{
		// if this is the last lower portal in the list, check if we need to go further down to find the real floor.
		if (GoDown(offset.X, offset.Y)) return Next(item);
	}
	if (onlast)
	{
		cursector = startsector;
		// We reached the end of the list. Check if we still need to check up- and downwards.
		if (GoUp(checkpoint.X, checkpoint.Y) ||
			GoDown(checkpoint.X, checkpoint.Y))
		{
			return Next(item);
		}
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}